

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O0

void __thiscall wabt::Action::Action(Action *this,ActionType type,Location *loc)

{
  Location *loc_local;
  ActionType type_local;
  Action *this_local;
  
  this->_vptr_Action = (_func_int **)&PTR__Action_00378380;
  (this->loc).filename._M_len = (loc->filename)._M_len;
  (this->loc).filename._M_str = (loc->filename)._M_str;
  (this->loc).field_1.field_1.offset = (loc->field_1).field_1.offset;
  *(undefined8 *)((long)&(this->loc).field_1 + 8) = *(undefined8 *)((long)&loc->field_1 + 8);
  Var::Var(&this->module_var);
  std::__cxx11::string::string((string *)&this->name);
  this->type_ = type;
  return;
}

Assistant:

explicit Action(ActionType type, const Location& loc = Location())
      : loc(loc), type_(type) {}